

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall
nonius::execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::execution_plan
          (execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *this,
          int iterations_per_sample,duration<double,_std::ratio<1L,_1L>_> estimated_duration,
          parameters *params,benchmark_function *benchmark,
          duration<double,_std::ratio<1L,_1L>_> warmup_time,int warmup_iterations)

{
  parameters *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  parameters *this_00;
  
  *in_RDI = in_ESI;
  *(undefined8 *)(in_RDI + 2) = in_XMM0_Qa;
  this_00 = (parameters *)(in_RDI + 4);
  parameters::parameters(this_00,in_RDX);
  nonius::detail::benchmark_function::benchmark_function
            ((benchmark_function *)this_00,(benchmark_function *)in_RDX);
  *(undefined8 *)(in_RDI + 0x14) = in_XMM1_Qa;
  in_RDI[0x16] = in_R8D;
  return;
}

Assistant:

execution_plan(int iterations_per_sample, Duration estimated_duration, parameters params, detail::benchmark_function benchmark, Duration warmup_time, int warmup_iterations)
            : iterations_per_sample(iterations_per_sample)
            , estimated_duration(estimated_duration)
            , params(params)
            , benchmark(benchmark)
            , warmup_time(warmup_time)
            , warmup_iterations(warmup_iterations)
        {}